

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O3

double __thiscall Alg::max_cover_topk(Alg *this,int targetSize)

{
  vector<unsigned_int,std::allocator<unsigned_int>> *this_00;
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint *puVar6;
  pointer puVar7;
  unsigned_long uVar8;
  iterator iVar9;
  pointer pvVar10;
  int iVar11;
  uint uVar12;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *nodes;
  ulong uVar13;
  pointer puVar14;
  ostream *poVar15;
  pointer *ppuVar16;
  ulong *puVar17;
  long lVar18;
  Alg *pAVar19;
  ulong uVar20;
  size_type __n;
  long lVar21;
  ulong uVar22;
  iterator __begin2;
  uint *puVar23;
  iterator __end2;
  ulong uVar24;
  bool bVar25;
  double dVar26;
  undefined1 auVar27 [16];
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double dVar32;
  undefined1 auVar31 [16];
  value_type seed;
  Nodelist sortedNode;
  FRset coverage;
  Nodelist degreePosition;
  Nodelist nodePosition;
  RRsets degMap;
  uint local_140;
  allocator_type local_139;
  _Bit_type *local_138;
  int local_12c;
  undefined1 local_128 [16];
  vector<bool,_std::allocator<bool>_> local_118;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_f0;
  Alg *local_d8;
  unsigned_long local_d0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_80;
  double local_68;
  double dStack_60;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_50;
  long local_48;
  long local_40;
  pointer local_38;
  
  local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_c8,(ulong)this->__numV,(value_type_conflict2 *)&local_118,
             (allocator_type *)&local_80);
  uVar13 = (ulong)this->__numV;
  if (uVar13 == 0) {
    uVar24 = 0;
  }
  else {
    ppuVar16 = (pointer *)
               ((long)&(this->__hyperG)._FRsets.
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar13 - 1].
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data + 8);
    uVar24 = 0;
    do {
      uVar20 = (long)*ppuVar16 - (long)((_Vector_impl_data *)(ppuVar16 + -1))->_M_start >> 3;
      if (uVar24 < uVar20) {
        uVar24 = uVar20;
      }
      ppuVar16 = ppuVar16 + -3;
      local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar13 - 1] = uVar20;
      uVar13 = uVar13 - 1;
    } while (uVar13 != 0);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&local_80,uVar24 + 1,(allocator_type *)&local_118);
  uVar12 = this->__numV - 1;
  local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       CONCAT44(local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,uVar12);
  if (this->__numV == 0) {
    __n = 0;
  }
  else {
    do {
      this_00 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                (local_80.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start +
                local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar12]);
      iVar9._M_current = *(uint **)(this_00 + 8);
      if (iVar9._M_current == *(uint **)(this_00 + 0x10)) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(this_00,iVar9,(uint *)&local_118);
      }
      else {
        *iVar9._M_current = uVar12;
        *(uint **)(this_00 + 8) = iVar9._M_current + 1;
      }
      bVar25 = (int)local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != 0;
      uVar12 = (int)local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p - 1;
      local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p =
           (_Bit_type *)
           CONCAT44(local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,uVar12);
    } while (bVar25);
    __n = (size_type)this->__numV;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_f0,__n,(allocator_type *)&local_118);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_98,(ulong)this->__numV,(allocator_type *)&local_118);
  local_d8 = this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_b0,uVar24 + 2,(allocator_type *)&local_118);
  pAVar19 = local_d8;
  if (local_80.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_80.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar12 = 0;
    lVar21 = 0;
    do {
      puVar23 = ((local_80.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      puVar6 = ((local_80.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar21 + 1] =
           (int)((ulong)((long)puVar6 - (long)puVar23) >> 2) +
           local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start[lVar21];
      for (; puVar6 != puVar23; puVar23 = puVar23 + 1) {
        local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[*puVar23] = uVar12;
        uVar13 = (ulong)uVar12;
        uVar12 = uVar12 + 1;
        local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar13] = *puVar23;
      }
      lVar21 = lVar21 + 1;
      local_80.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_80.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 1;
    } while (local_80.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             local_80.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_140 = local_140 & 0xffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_118,local_d8->__numRRsets,(bool *)&local_140,&local_139);
  if (uVar24 + 1 == 0) {
    lVar21 = 0;
  }
  else {
    lVar21 = 0;
    do {
      if (local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar24] <= pAVar19->__numV - targetSize) {
        lVar21 = lVar21 + uVar24 * ((targetSize - pAVar19->__numV) +
                                   local_b0.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[uVar24 + 1]);
        break;
      }
      lVar21 = lVar21 + (local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar24 + 1] -
                        local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar24]) * uVar24;
      bVar25 = uVar24 != 0;
      uVar24 = uVar24 - 1;
    } while (bVar25);
  }
  auVar29._8_4_ = (int)((ulong)lVar21 >> 0x20);
  auVar29._0_8_ = lVar21;
  auVar29._12_4_ = 0x45300000;
  dVar26 = (auVar29._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar21) - 4503599627370496.0);
  pAVar19->__boundMin = dVar26;
  puVar7 = (pAVar19->__vecSeed).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((pAVar19->__vecSeed).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar7) {
    (pAVar19->__vecSeed).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar7;
  }
  if (targetSize == 0) {
    dVar28 = pAVar19->__boundLast;
    local_128 = ZEXT816(0);
  }
  else {
    local_50 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&pAVar19->__vecSeed;
    local_48 = (long)targetSize;
    lVar18 = 0;
    local_68 = -3.11261356879985e-322;
    puVar14 = local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    iVar11 = targetSize;
    do {
      local_12c = iVar11;
      local_140 = local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1];
      local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
      uVar13 = ((long)local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2) - local_48;
      uVar8 = puVar14[local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar13]];
      local_d0 = puVar14[local_140];
      iVar9._M_current =
           (pAVar19->__vecSeed).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_40 = lVar18;
      if (iVar9._M_current ==
          (pAVar19->__vecSeed).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(local_50,iVar9,&local_140);
        puVar14 = local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start;
      }
      else {
        *iVar9._M_current = local_140;
        (pAVar19->__vecSeed).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
        .super__Vector_impl_data._M_finish = iVar9._M_current + 1;
      }
      lVar21 = (lVar21 + uVar8) - local_d0;
      uVar24 = (ulong)local_140;
      puVar14[uVar24] = 0;
      pvVar10 = (pAVar19->__hyperG)._FRsets.
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar17 = pvVar10[uVar24].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_128._0_8_ =
           *(pointer *)
            ((long)&pvVar10[uVar24].
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data + 8);
      if (puVar17 != (ulong *)local_128._0_8_) {
        local_138 = local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        local_38 = (pAVar19->__hyperG)._RRsets.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        do {
          uVar24 = *puVar17;
          uVar20 = uVar24 + 0x3f;
          if (-1 < (long)uVar24) {
            uVar20 = uVar24;
          }
          uVar22 = (ulong)((uVar24 & (ulong)local_68) < 0x8000000000000001);
          if ((local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_start.super__Bit_iterator_base._M_p[((long)uVar20 >> 6) + (uVar22 - 1)] >>
               (uVar24 & 0x3f) & 1) == 0) {
            local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[((long)uVar20 >> 6) + (uVar22 - 1)] =
                 local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [((long)uVar20 >> 6) + (uVar22 - 1)] | 1L << ((byte)uVar24 & 0x3f);
            puVar6 = *(pointer *)
                      ((long)&local_38[uVar24].
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data + 8);
            for (puVar23 = local_38[uVar24].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start; puVar23 != puVar6;
                puVar23 = puVar23 + 1) {
              uVar12 = *puVar23;
              uVar8 = puVar14[uVar12];
              if (uVar8 != 0) {
                uVar2 = local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar12];
                uVar3 = local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar8];
                uVar24 = (ulong)uVar3;
                uVar4 = local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar24];
                uVar5 = local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar2];
                local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar2] = uVar4;
                local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar24] = uVar5;
                local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar12] = uVar3;
                local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar4] = uVar2;
                local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar8] =
                     local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar8] + 1;
                puVar14[uVar12] = uVar8 - 1;
                lVar21 = lVar21 + -1 + (ulong)(uVar24 < uVar13);
              }
            }
          }
          puVar17 = puVar17 + 1;
        } while (puVar17 != (ulong *)local_128._0_8_);
      }
      lVar18 = local_40 + local_d0;
      lVar1 = lVar21 + lVar18;
      auVar27._8_4_ = (int)((ulong)lVar1 >> 0x20);
      auVar27._0_8_ = lVar1;
      auVar27._12_4_ = 0x45300000;
      dVar28 = (auVar27._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0);
      local_d8->__boundLast = dVar28;
      dVar26 = local_d8->__boundMin;
      if (dVar28 < local_d8->__boundMin) {
        local_d8->__boundMin = dVar28;
        dVar26 = dVar28;
      }
      pAVar19 = local_d8;
      iVar11 = local_12c + -1;
    } while (local_12c + -1 != 0);
    auVar30._8_4_ = (int)((ulong)lVar18 >> 0x20);
    auVar30._0_8_ = lVar18;
    auVar30._12_4_ = 0x45300000;
    dVar32 = auVar30._8_8_ - 1.9342813113834067e+25;
    local_128._8_4_ = SUB84(dVar32,0);
    local_128._0_8_ = dVar32 + ((double)CONCAT44(0x43300000,(int)lVar18) - 4503599627370496.0);
    local_128._12_4_ = (int)((ulong)dVar32 >> 0x20);
  }
  local_138 = (_Bit_type *)(double)pAVar19->__numV;
  auVar31._0_8_ = (double)CONCAT44(0x43300000,(int)pAVar19->__numRRsets);
  auVar31._8_4_ = (int)(pAVar19->__numRRsets >> 0x20);
  auVar31._12_4_ = 0x45300000;
  dStack_60 = auVar31._8_8_ - 1.9342813113834067e+25;
  local_68 = dStack_60 + (auVar31._0_8_ - 4503599627370496.0);
  pAVar19->__boundMin = dVar26 * ((double)local_138 / local_68);
  pAVar19->__boundLast = ((double)local_138 / local_68) * dVar28;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  >>>[greedy-topk] influence: ",0x1e);
  local_128._0_8_ = ((double)local_128._0_8_ * (double)local_138) / local_68;
  poVar15 = std::ostream::_M_insert<double>((double)local_128._0_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,", min-bound: ",0xd);
  poVar15 = std::ostream::_M_insert<double>(pAVar19->__boundMin);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,", last-bound: ",0xe);
  poVar15 = std::ostream::_M_insert<double>(pAVar19->__boundLast);
  local_140 = CONCAT31(local_140._1_3_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,(char *)&local_140,1);
  if (local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  if (local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_80);
  if (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (double)local_128._0_8_;
}

Assistant:

double Alg::max_cover_topk(const int targetSize)
{
    FRset coverage(__numV, 0);
    size_t maxDeg = 0;
    for (auto i = __numV; i--;)
    {
        const auto deg = __hyperG._FRsets[i].size();
        coverage[i] = deg;
        if (deg > maxDeg) maxDeg = deg;
    }
    RRsets degMap(maxDeg + 1); // degMap: map degree to the nodes with this degree
    for (auto i = __numV; i--;)
    {
        //if (coverage[i] == 0) continue;
        degMap[coverage[i]].push_back(i);
    }
    Nodelist sortedNode(__numV); // sortedNode: record the sorted nodes in ascending order of degree
    Nodelist nodePosition(__numV); // nodePosition: record the position of each node in the sortedNode
    Nodelist degreePosition(maxDeg + 2); // degreePosition: the start position of each degree in sortedNode
    uint32_t idxSort = 0;
    size_t idxDegree = 0;
    for (auto& nodes : degMap)
    {
        degreePosition[idxDegree + 1] = degreePosition[idxDegree] + (uint32_t)nodes.size();
        idxDegree++;
        for (auto& node : nodes)
        {
            nodePosition[node] = idxSort;
            sortedNode[idxSort++] = node;
        }
    }
    // check if an edge is removed
    std::vector<bool> edgeMark(__numRRsets, false);
    // record the total of top-k marginal gains
    size_t sumTopk = 0;
    for (auto deg = maxDeg + 1; deg--;)
    {
        if (degreePosition[deg] <= __numV - targetSize)
        {
            sumTopk += deg * (degreePosition[deg + 1] - (__numV - targetSize));
            break;
        }
        sumTopk += deg * (degreePosition[deg + 1] - degreePosition[deg]);
    }
    __boundMin = 1.0 * sumTopk;
    __vecSeed.clear();
    size_t sumInf = 0;
    /*
    * sortedNode: position -> node
    * nodePosition: node -> position
    * degreePosition: degree -> position (start position of this degree)
    * coverage: node -> degree
    * e.g., swap the position of a node with the start position of its degree
    * swap(sortedNode[nodePosition[node]], sortedNode[degreePosition[coverage[node]]])
    */
    for (auto k = targetSize; k--;)
    {
        const auto seed = sortedNode.back();
        sortedNode.pop_back();
        const auto newNumV = sortedNode.size();
        sumTopk += coverage[sortedNode[newNumV - targetSize]] - coverage[seed];
        sumInf += coverage[seed];
        __vecSeed.push_back(seed);
        coverage[seed] = 0;
        for (auto edgeIdx : __hyperG._FRsets[seed])
        {
            if (edgeMark[edgeIdx]) continue;
            edgeMark[edgeIdx] = true;
            for (auto nodeIdx : __hyperG._RRsets[edgeIdx])
            {
                if (coverage[nodeIdx] == 0) continue; // This node is seed, skip
                const auto currPos = nodePosition[nodeIdx]; // The current position
                const auto currDeg = coverage[nodeIdx]; // The current degree
                const auto startPos = degreePosition[currDeg]; // The start position of this degree
                const auto startNode = sortedNode[startPos]; // The node with the start position
                // Swap this node to the start position with the same degree, and update their positions in nodePosition
                std::swap(sortedNode[currPos], sortedNode[startPos]);
                nodePosition[nodeIdx] = startPos;
                nodePosition[startNode] = currPos;
                // Increase the start position of this degree by 1, and decrease the degree of this node by 1
                degreePosition[currDeg]++;
                coverage[nodeIdx]--;
                // If the start position of this degree is in top-k, reduce topk by 1
                if (startPos >= newNumV - targetSize) sumTopk--;
            }
        }
        __boundLast = 1.0 * (sumInf + sumTopk);
        if (__boundMin > __boundLast) __boundMin = __boundLast;
    }
    __boundMin *= 1.0 * __numV / __numRRsets;
    __boundLast *= 1.0 * __numV / __numRRsets;
    const auto finalInf = 1.0 * sumInf * __numV / __numRRsets;
    std::cout << "  >>>[greedy-topk] influence: " << finalInf << ", min-bound: " << __boundMin <<
              ", last-bound: " << __boundLast << '\n';
    return finalInf;
}